

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O3

void Unr_ManSetup(Unr_Man_t *p,int fVerbose)

{
  uint uVar1;
  int *piVar2;
  bool bVar3;
  Vec_Int_t *pVVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  Vec_Int_t *vRoots;
  int *piVar9;
  Vec_Int_t *__ptr;
  Gia_Man_t *pGVar10;
  undefined4 *__s;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  undefined8 uVar19;
  int iVar20;
  Gia_Obj_t *pGVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  size_t __nmemb;
  uint uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  timespec ts;
  timespec local_50;
  ulong local_40;
  size_t local_38;
  
  iVar8 = clock_gettime(3,&local_50);
  if (iVar8 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (p->vOrder->nSize != 0) {
    __assert_fail("Vec_IntSize(p->vOrder) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                  ,0xc2,"void Unr_ManSetup(Unr_Man_t *, int)");
  }
  Vec_IntPush(p->vOrder,0);
  Vec_IntPush(p->vOrderLim,p->vOrder->nSize);
  if (p->vTents->nSize < 1) {
LAB_005bf43a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *p->vTents->pArray = 0;
  if (p->vRanks->nSize < 1) goto LAB_005bf43a;
  *p->vRanks->pArray = 0;
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  piVar9 = (int *)malloc(400);
  vRoots->pArray = piVar9;
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 100;
  __ptr->nSize = 0;
  piVar9 = (int *)malloc(400);
  __ptr->pArray = piVar9;
  pGVar10 = p->pGia;
  pVVar12 = pGVar10->vCos;
  uVar14 = (ulong)(uint)pVVar12->nSize;
  if (pGVar10->nRegs < pVVar12->nSize) {
    lVar25 = 0;
    do {
      if ((int)uVar14 <= lVar25) goto LAB_005bf3dd;
      iVar8 = pVVar12->pArray[lVar25];
      if ((iVar8 < 0) || (pGVar10->nObjs <= iVar8)) goto LAB_005bf3fc;
      if (pGVar10->pObjs == (Gia_Obj_t *)0x0) break;
      Unr_ManSetup_rec(p,iVar8,0,vRoots);
      lVar25 = lVar25 + 1;
      pGVar10 = p->pGia;
      pVVar12 = pGVar10->vCos;
      uVar14 = (ulong)pVVar12->nSize;
    } while (lVar25 < (long)(uVar14 - (long)pGVar10->nRegs));
    iVar8 = vRoots->nSize;
    piVar9 = &vRoots->nSize;
    pVVar12 = __ptr;
    while (pVVar4 = vRoots, vRoots = pVVar4, __ptr = pVVar12, 0 < iVar8) {
      Vec_IntPush(p->vOrderLim,p->vOrder->nSize);
      pVVar12->nSize = 0;
      vRoots = pVVar12;
      __ptr = pVVar4;
      if (pVVar4->nSize < 1) break;
      lVar25 = 0;
      do {
        Unr_ManSetup_rec(p,pVVar4->pArray[lVar25],p->vOrderLim->nSize + -1,pVVar12);
        lVar25 = lVar25 + 1;
      } while (lVar25 < *piVar9);
      iVar8 = pVVar12->nSize;
      piVar9 = &pVVar12->nSize;
      pVVar12 = pVVar4;
    }
  }
  Vec_IntPush(p->vOrderLim,p->vOrder->nSize);
  if (vRoots->pArray != (int *)0x0) {
    free(vRoots->pArray);
  }
  free(vRoots);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  lVar25 = (long)p->vOrder->nSize;
  if (lVar25 < 1) {
    uVar14 = 0;
  }
  else {
    lVar16 = 0;
    uVar14 = 0;
    do {
      iVar8 = p->vOrder->pArray[lVar16];
      if (((long)iVar8 < 0) || (p->vRanks->nSize <= iVar8)) goto LAB_005bf3dd;
      uVar14 = (ulong)((int)uVar14 + (p->vRanks->pArray[iVar8] + 1U & 0xfffffffe) + 6);
      lVar16 = lVar16 + 1;
    } while (lVar25 != lVar16);
  }
  __nmemb = (size_t)(int)uVar14;
  piVar9 = (int *)calloc(__nmemb,4);
  p->pObjs = piVar9;
  p->pEnd = piVar9 + __nmemb;
  if ((int)uVar14 < 1) {
LAB_005bf41b:
    __assert_fail("h >= 0 && h < p->pEnd - p->pObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                  ,0x44,"Unr_Obj_t *Unr_ManObj(Unr_Man_t *, int)");
  }
  local_40 = uVar14;
  if (p->vRanks->nSize < 1) {
LAB_005bf3dd:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar26 = *p->vRanks->pArray + 1;
  *(ulong *)(piVar9 + 2) = ((ulong)(uVar26 & 0x7fff) << 0x22) + 0xfffffffc;
  piVar9[5] = 0;
  uVar1 = p->nObjs;
  uVar22 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar22 = uVar1;
  }
  if ((uVar22 == 0) ||
     (__s = (undefined4 *)malloc((long)(int)uVar22 << 2), __s == (undefined4 *)0x0)) {
    __s = (undefined4 *)0x0;
  }
  else {
    memset(__s,0xff,(long)(int)uVar1 << 2);
  }
  if ((int)uVar1 < 1) goto LAB_005bf43a;
  *__s = 0;
  local_38 = __nmemb;
  if (p->vObjLim->nSize != 0) {
    __assert_fail("Vec_IntSize(p->vObjLim) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                  ,0xe8,"void Unr_ManSetup(Unr_Man_t *, int)");
  }
  piVar15 = piVar9 + (ulong)(uVar26 & 0x7ffe) + 6;
  iVar8 = p->vOrderLim->nSize;
  if (1 < iVar8) {
    uVar14 = (ulong)(iVar8 - 2);
    do {
      uVar22 = p->vOrderLim->nSize;
      if (((long)(int)uVar22 <= (long)uVar14) || ((ulong)uVar22 <= uVar14 + 1)) goto LAB_005bf3dd;
      piVar9 = p->vOrderLim->pArray;
      uVar22 = piVar9[uVar14];
      uVar11 = (ulong)uVar22;
      iVar8 = piVar9[uVar14 + 1];
      Vec_IntPush(p->vObjLim,(int)((ulong)((long)piVar15 - (long)p->pObjs) >> 2));
      auVar7 = _DAT_0094f530;
      auVar6 = _DAT_0094e250;
      auVar5 = _DAT_0094e240;
      uVar26 = uVar22;
      while ((int)uVar26 < iVar8) {
        if (((int)uVar22 < 0) || (p->vOrder->nSize <= (int)uVar11)) goto LAB_005bf3dd;
        iVar17 = p->vOrder->pArray[uVar11];
        lVar25 = (long)iVar17;
        if ((lVar25 < 0) || (p->pGia->nObjs <= iVar17)) goto LAB_005bf3fc;
        piVar9 = p->pObjs;
        if ((((long)piVar15 - (long)piVar9 & 0x200000000U) != 0) ||
           (uVar23 = (ulong)((uint)((ulong)((long)piVar15 - (long)piVar9) >> 2) & 0x7fffffff),
           (long)p->pEnd - (long)piVar9 >> 2 <= (long)uVar23)) goto LAB_005bf41b;
        pGVar21 = p->pGia->pObjs + lVar25;
        uVar18 = *(ulong *)(piVar9 + uVar23 + 2) | 0xfffffffc;
        *(ulong *)(piVar9 + uVar23 + 2) = uVar18;
        uVar19 = *(undefined8 *)pGVar21;
        if ((~(uint)uVar19 & 0x1fffffff) == 0) {
LAB_005bec51:
          if ((((uint)uVar19 & 0x9fffffff) == 0x9fffffff) &&
             (p->pGia->vCis->nSize - p->pGia->nRegs <=
              (int)((uint)((ulong)uVar19 >> 0x20) & 0x1fffffff))) {
            uVar18 = uVar18 & 0xfffffffffffe0003;
            goto LAB_005bed00;
          }
        }
        else {
          uVar26 = p->vTents->nSize;
          if ((((int)uVar26 <= iVar17) ||
              (uVar27 = iVar17 - ((uint)uVar19 & 0x1fffffff), (int)uVar27 < 0)) ||
             (uVar26 <= uVar27)) goto LAB_005bf3dd;
          piVar2 = p->vTents->pArray;
          uVar26 = ~piVar2[uVar27] + piVar2[lVar25];
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          uVar18 = (uVar18 & 0xfffffffffffe0003) + (ulong)(uVar26 & 0x7fff) * 4;
          *(ulong *)(piVar9 + uVar23 + 2) = uVar18;
          uVar19 = *(undefined8 *)pGVar21;
          if ((int)(uint)uVar19 < 0 || (~(uint)uVar19 & 0x1fffffff) == 0) goto LAB_005bec51;
          uVar26 = p->vTents->nSize;
          if ((((int)uVar26 <= iVar17) ||
              (uVar27 = iVar17 - ((uint)((ulong)uVar19 >> 0x20) & 0x1fffffff), (int)uVar27 < 0)) ||
             (uVar26 <= uVar27)) goto LAB_005bf3dd;
          piVar2 = p->vTents->pArray;
          iVar20 = ~piVar2[uVar27] + piVar2[lVar25];
          if (iVar20 < 1) {
            iVar20 = 0;
          }
          uVar18 = uVar18 & 0xffffffff0001ffff | (ulong)(uint)(iVar20 << 0x11);
LAB_005bed00:
          *(ulong *)(piVar9 + uVar23 + 2) = uVar18;
        }
        if (p->vRanks->nSize <= iVar17) goto LAB_005bf3dd;
        uVar26 = p->vRanks->pArray[lVar25] + 1;
        *(ulong *)(piVar9 + uVar23 + 2) =
             uVar18 & 0x3ffffffff | (ulong)uVar26 << 0x22 | 0xfffe000000000000;
        piVar9[uVar23 + 4] = iVar17;
        uVar26 = uVar26 & 0x7fff;
        if (uVar26 != 0) {
          lVar16 = (ulong)uVar26 - 1;
          auVar28._8_4_ = (int)lVar16;
          auVar28._0_8_ = lVar16;
          auVar28._12_4_ = (int)((ulong)lVar16 >> 0x20);
          auVar28 = auVar28 ^ auVar6;
          uVar18 = 0;
          auVar29 = auVar5;
          auVar30 = auVar7;
          do {
            auVar31 = auVar29 ^ auVar6;
            iVar20 = auVar28._4_4_;
            if ((bool)(~(auVar31._4_4_ == iVar20 && auVar28._0_4_ < auVar31._0_4_ ||
                        iVar20 < auVar31._4_4_) & 1)) {
              *(undefined4 *)((long)piVar9 + uVar18 + uVar23 * 4 + 0x14) = 0xffffffff;
            }
            if ((auVar31._12_4_ != auVar28._12_4_ || auVar31._8_4_ <= auVar28._8_4_) &&
                auVar31._12_4_ <= auVar28._12_4_) {
              *(undefined4 *)((long)piVar9 + uVar18 + uVar23 * 4 + 0x18) = 0xffffffff;
            }
            iVar32 = SUB164(auVar30 ^ auVar6,4);
            if (iVar32 <= iVar20 &&
                (iVar32 != iVar20 || SUB164(auVar30 ^ auVar6,0) <= auVar28._0_4_)) {
              *(undefined4 *)((long)piVar9 + uVar18 + uVar23 * 4 + 0x1c) = 0xffffffff;
              *(undefined4 *)((long)piVar9 + uVar18 + uVar23 * 4 + 0x20) = 0xffffffff;
            }
            lVar16 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 4;
            auVar29._8_8_ = lVar16 + 4;
            lVar16 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 4;
            auVar30._8_8_ = lVar16 + 4;
            uVar18 = uVar18 + 0x10;
          } while ((uVar26 * 4 + 0xc & 0xfffffff0) != uVar18);
        }
        uVar18 = (long)piVar15 - (long)p->pObjs;
        if ((uVar18 & 4) != 0) {
          __assert_fail("((pInts - p->pObjs) & 1) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                        ,0xfe,"void Unr_ManSetup(Unr_Man_t *, int)");
        }
        if ((int)uVar1 <= iVar17) goto LAB_005bf43a;
        __s[lVar25] = (int)(uVar18 >> 2);
        piVar15 = piVar15 + (ulong)((uint)((ulong)*(undefined8 *)(piVar9 + uVar23 + 2) >> 0x22) &
                                   0x7ffe) + 6;
        uVar11 = uVar11 + 1;
        uVar26 = (uint)uVar11;
      }
      bVar3 = 0 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar3);
    piVar9 = p->pObjs;
  }
  if ((long)piVar15 - (long)piVar9 >> 2 != local_38) {
    __assert_fail("pInts - p->pObjs == nInts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                  ,0x103,"void Unr_ManSetup(Unr_Man_t *, int)");
  }
  pGVar10 = p->pGia;
  if (0 < pGVar10->nObjs) {
    lVar25 = 0;
    uVar14 = 0;
    do {
      pGVar21 = pGVar10->pObjs;
      if (pGVar21 == (Gia_Obj_t *)0x0) break;
      if (uVar1 == uVar14) goto LAB_005bf3dd;
      uVar11 = (ulong)(uint)__s[uVar14];
      if (uVar11 != 0xffffffff) {
        if (((int)__s[uVar14] < 0) ||
           (piVar9 = p->pObjs, (long)p->pEnd - (long)piVar9 >> 2 <= (long)uVar11))
        goto LAB_005bf41b;
        uVar23 = *(ulong *)(&pGVar21->field_0x0 + lVar25);
        if ((~(uint)uVar23 & 0x1fffffff) != 0) {
          uVar23 = -((uint)uVar23 & 0x1fffffff) + uVar14;
          uVar22 = (uint)uVar23;
          if (((int)uVar22 < 0) || (uVar1 <= uVar22)) goto LAB_005bf3dd;
          piVar9[uVar11] = __s[uVar23 & 0xffffffff];
          uVar18 = (ulong)(*(uint *)(&pGVar21->field_0x0 + lVar25) >> 0x1d & 1);
          uVar23 = *(ulong *)(piVar9 + uVar11 + 2);
          *(ulong *)(piVar9 + uVar11 + 2) = uVar23 & 0xfffffffffffffffe | uVar18;
          uVar22 = (uint)*(undefined8 *)(&pGVar21->field_0x0 + lVar25);
          if ((~uVar22 & 0x1fffffff) == 0 || -1 < (int)uVar22) {
            uVar24 = 0;
          }
          else {
            uVar24 = 0;
            if ((int)((uint)((ulong)*(undefined8 *)(&pGVar21->field_0x0 + lVar25) >> 0x20) &
                     0x1fffffff) < p->pGia->vCos->nSize - p->pGia->nRegs) {
              uVar24 = 0x200000000;
            }
          }
          *(ulong *)(piVar9 + uVar11 + 2) = uVar23 & 0xfffffffdfffffffe | uVar18 | uVar24;
          uVar23 = *(ulong *)(&pGVar21->field_0x0 + lVar25);
          if (-1 < (int)(uint)uVar23 && (~(uint)uVar23 & 0x1fffffff) != 0) {
            uVar23 = -((uint)(uVar23 >> 0x20) & 0x1fffffff) + uVar14;
            uVar22 = (uint)uVar23;
            if ((-1 < (int)uVar22) && (uVar22 < uVar1)) {
              piVar9[uVar11 + 1] = __s[uVar23 & 0xffffffff];
              *(ulong *)(piVar9 + uVar11 + 2) =
                   *(ulong *)(piVar9 + uVar11 + 2) & 0xfffffffffffffffd |
                   (ulong)((uint)((ulong)*(undefined8 *)(&pGVar21->field_0x0 + lVar25) >> 0x3c) & 2)
              ;
              goto LAB_005bf14c;
            }
            goto LAB_005bf3dd;
          }
        }
        if (((uint)uVar23 & 0x9fffffff) == 0x9fffffff) {
          pGVar10 = p->pGia;
          uVar22 = (uint)(uVar23 >> 0x20) & 0x1fffffff;
          iVar8 = pGVar10->vCis->nSize;
          if ((int)uVar22 < iVar8 - pGVar10->nRegs) {
            if ((uVar23 >> 0x1f & 1) == 0) {
              __assert_fail("pObj->fTerm",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
            }
            piVar9[uVar11] = uVar22;
            if ((long)p->vTents->nSize <= (long)uVar14) goto LAB_005bf3dd;
            piVar9[uVar11 + 1] = p->vTents->pArray[uVar14];
            *(ulong *)(piVar9 + uVar11 + 2) = *(ulong *)(piVar9 + uVar11 + 2) | 0x100000000;
          }
          else {
            iVar17 = pGVar10->vCos->nSize;
            uVar22 = (iVar17 - iVar8) + uVar22;
            if (((int)uVar22 < 0) || (iVar17 <= (int)uVar22)) goto LAB_005bf3dd;
            uVar22 = pGVar10->vCos->pArray[uVar22];
            if (((long)(int)uVar22 < 0) || (pGVar10->nObjs <= (int)uVar22)) goto LAB_005bf3fc;
            if (uVar1 <= uVar22) goto LAB_005bf3dd;
            piVar9[uVar11] = __s[(int)uVar22];
            *(byte *)(piVar9 + uVar11 + 2) = *(byte *)(piVar9 + uVar11 + 2) & 0xfe;
          }
        }
      }
LAB_005bf14c:
      uVar14 = uVar14 + 1;
      pGVar10 = p->pGia;
      lVar25 = lVar25 + 0xc;
    } while ((long)uVar14 < (long)pGVar10->nObjs);
  }
  pVVar12 = pGVar10->vCis;
  if (0 < pVVar12->nSize) {
    lVar25 = 0;
    do {
      iVar8 = pVVar12->pArray[lVar25];
      if (((long)iVar8 < 0) || (pGVar10->nObjs <= iVar8)) goto LAB_005bf3fc;
      if (pGVar10->pObjs == (Gia_Obj_t *)0x0) break;
      if ((int)uVar1 <= iVar8) goto LAB_005bf3dd;
      Vec_IntPush(p->vCiMap,__s[iVar8]);
      lVar25 = lVar25 + 1;
      pGVar10 = p->pGia;
      pVVar12 = pGVar10->vCis;
    } while (lVar25 < pVVar12->nSize);
  }
  pVVar12 = pGVar10->vCos;
  if (0 < pVVar12->nSize) {
    lVar25 = 0;
    do {
      iVar8 = pVVar12->pArray[lVar25];
      if (((long)iVar8 < 0) || (pGVar10->nObjs <= iVar8)) {
LAB_005bf3fc:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar10->pObjs == (Gia_Obj_t *)0x0) break;
      if ((int)uVar1 <= iVar8) goto LAB_005bf3dd;
      Vec_IntPush(p->vCoMap,__s[iVar8]);
      lVar25 = lVar25 + 1;
      pGVar10 = p->pGia;
      pVVar12 = pGVar10->vCos;
    } while (lVar25 < pVVar12->nSize);
  }
  free(__s);
  if (fVerbose != 0) {
    Unr_ManProfileRanks(p->vRanks);
    printf("Memory usage = %6.2f MB  ",(double)(int)local_40 * 4.0 * 9.5367431640625e-07);
    iVar17 = 3;
    iVar8 = clock_gettime(3,&local_50);
    if (iVar8 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(iVar17,"%s =","Time");
    Abc_Print(iVar17,"%9.2f sec\n",(double)(lVar25 + lVar13) / 1000000.0);
  }
  pVVar12 = p->vOrder;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vOrder->pArray = (int *)0x0;
      pVVar12 = p->vOrder;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_005bf31a;
    }
    free(pVVar12);
    p->vOrder = (Vec_Int_t *)0x0;
  }
LAB_005bf31a:
  pVVar12 = p->vOrderLim;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vOrderLim->pArray = (int *)0x0;
      pVVar12 = p->vOrderLim;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_005bf356;
    }
    free(pVVar12);
    p->vOrderLim = (Vec_Int_t *)0x0;
  }
LAB_005bf356:
  pVVar12 = p->vRanks;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vRanks->pArray = (int *)0x0;
      pVVar12 = p->vRanks;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_005bf392;
    }
    free(pVVar12);
    p->vRanks = (Vec_Int_t *)0x0;
  }
LAB_005bf392:
  pVVar12 = p->vTents;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vTents->pArray = (int *)0x0;
      pVVar12 = p->vTents;
      if (pVVar12 == (Vec_Int_t *)0x0) {
        return;
      }
    }
    free(pVVar12);
    p->vTents = (Vec_Int_t *)0x0;
  }
  return;
}

Assistant:

void Unr_ManSetup( Unr_Man_t * p, int fVerbose )
{
    Vec_Int_t * vRoots, * vRoots2, * vMap;
    Unr_Obj_t * pUnrObj;
    Gia_Obj_t * pObj;
    int i, k, t, iObj, nInts, * pInts;
    abctime clk = Abc_Clock();
    // create zero rank
    assert( Vec_IntSize(p->vOrder) == 0 );
    Vec_IntPush( p->vOrder, 0 );
    Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
    Vec_IntWriteEntry( p->vTents, 0, 0 );
    Vec_IntWriteEntry( p->vRanks, 0, 0 );
    // start from the POs
    vRoots  = Vec_IntAlloc( 100 );
    vRoots2 = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p->pGia, pObj, i )
        Unr_ManSetup_rec( p, Gia_ObjId(p->pGia, pObj), 0, vRoots );
    // collect tents
    while ( Vec_IntSize(vRoots) > 0 )
    {
        Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
        Vec_IntClear( vRoots2 );
        Vec_IntForEachEntry( vRoots, iObj, i )
            Unr_ManSetup_rec( p, iObj, Vec_IntSize(p->vOrderLim)-1, vRoots2 );
        ABC_SWAP( Vec_Int_t *, vRoots, vRoots2 );
    }
    Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
    Vec_IntFree( vRoots );
    Vec_IntFree( vRoots2 );
    // allocate memory
    nInts = 0;
    Vec_IntForEachEntry( p->vOrder, iObj, i )
        nInts += Unr_ObjSizeInt( Vec_IntEntry(p->vRanks, iObj) + 1 );
    p->pObjs = pInts = ABC_CALLOC( int, nInts );
    p->pEnd = p->pObjs + nInts;
    // create const0 node
    pUnrObj = Unr_ManObj( p, pInts - p->pObjs );
    pUnrObj->RankMax = Vec_IntEntry(p->vRanks, 0) + 1;
    pUnrObj->uRDiff0 = pUnrObj->uRDiff1 = UNR_DIFF_NULL;
    pUnrObj->Res[0]  = 0; // const0
    // map the objects
    vMap = Vec_IntStartFull( p->nObjs );
    Vec_IntWriteEntry( vMap, 0, pInts - p->pObjs );
    pInts += Unr_ObjSize(pUnrObj);
    // mark up the entries
    assert( Vec_IntSize(p->vObjLim) == 0 );
    for ( t = Vec_IntSize(p->vOrderLim) - 2; t >= 0; t-- )
    {
        int Beg = Vec_IntEntry(p->vOrderLim, t);
        int End = Vec_IntEntry(p->vOrderLim, t+1);
        Vec_IntPush( p->vObjLim, pInts - p->pObjs );
        Vec_IntForEachEntryStartStop( p->vOrder, iObj, i, Beg, End )
        {
            pObj = Gia_ManObj( p->pGia, iObj );
            pUnrObj = Unr_ManObj( p, pInts - p->pObjs );
            pUnrObj->uRDiff0 = pUnrObj->uRDiff1 = UNR_DIFF_NULL;
            if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
                pUnrObj->uRDiff0 = Abc_MaxInt(0, Vec_IntEntry(p->vTents, iObj) - Vec_IntEntry(p->vTents, Gia_ObjFaninId0(pObj, iObj)) - 1);
            if ( Gia_ObjIsAnd(pObj) )
                pUnrObj->uRDiff1 = Abc_MaxInt(0, Vec_IntEntry(p->vTents, iObj) - Vec_IntEntry(p->vTents, Gia_ObjFaninId1(pObj, iObj)) - 1);
            else if ( Gia_ObjIsRo(p->pGia, pObj) )
                pUnrObj->uRDiff0 = 0;
            pUnrObj->RankMax = Vec_IntEntry(p->vRanks, iObj) + 1;
            pUnrObj->RankCur = UNR_DIFF_NULL;
            pUnrObj->OrigId  = iObj;
            for ( k = 0; k < (int)pUnrObj->RankMax; k++ )
                pUnrObj->Res[k] = -1;
            assert( ((pInts - p->pObjs) & 1) == 0 ); // align for 64-bits
            Vec_IntWriteEntry( vMap, iObj, pInts - p->pObjs );
            pInts += Unr_ObjSize( pUnrObj );
        }
    }
    assert( pInts - p->pObjs == nInts );
    // label the objects
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == -1 )
            continue;
        pUnrObj = Unr_ManObj( p, Vec_IntEntry(vMap, i) );
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
        {
            pUnrObj->hFan0   = Vec_IntEntry( vMap, Gia_ObjFaninId0(pObj, i) );
            pUnrObj->fCompl0 = Gia_ObjFaninC0(pObj);
            pUnrObj->fItIsPo = Gia_ObjIsPo(p->pGia, pObj);
        }
        if ( Gia_ObjIsAnd(pObj) )
        {
            pUnrObj->hFan1   = Vec_IntEntry( vMap, Gia_ObjFaninId1(pObj, i) );
            pUnrObj->fCompl1 = Gia_ObjFaninC1(pObj);
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pUnrObj->hFan0   = Vec_IntEntry( vMap, Gia_ObjId(p->pGia, Gia_ObjRoToRi(p->pGia, pObj)) );
            pUnrObj->fCompl0 = 0;
        }
        else if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            pUnrObj->hFan0   = Gia_ObjCioId(pObj);           // remember CIO id
            pUnrObj->hFan1   = Vec_IntEntry(p->vTents, i);   // remember tent
            pUnrObj->fItIsPi = 1;
        }
    }
    // store CI/PO objects;
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntPush( p->vCiMap, Vec_IntEntry(vMap, Gia_ObjId(p->pGia, pObj)) );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Vec_IntPush( p->vCoMap, Vec_IntEntry(vMap, Gia_ObjId(p->pGia, pObj)) );
    Vec_IntFreeP( &vMap );
    // print stats
    if ( fVerbose )
    {
        Unr_ManProfileRanks( p->vRanks );
        printf( "Memory usage = %6.2f MB  ", 4.0 * nInts / (1<<20) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vOrderLim );
    Vec_IntFreeP( &p->vRanks );
    Vec_IntFreeP( &p->vTents );
}